

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsFieldGet(FmsField field,FmsFieldDescriptor *fd,FmsInt *num_vec_comp,
               FmsLayoutType *layout_type,FmsScalarType *data_type,void **data)

{
  if (field != (FmsField)0x0) {
    if (fd != (FmsFieldDescriptor *)0x0) {
      *fd = field->fd;
    }
    if (num_vec_comp != (FmsInt *)0x0) {
      *num_vec_comp = field->num_vec_comp;
    }
    if (layout_type != (FmsLayoutType *)0x0) {
      *layout_type = field->layout;
    }
    if (data_type != (FmsScalarType *)0x0) {
      *data_type = field->scalar_type;
    }
    if (data != (void **)0x0) {
      *data = field->data;
    }
    return 0;
  }
  return 1;
}

Assistant:

int FmsFieldGet(FmsField field, FmsFieldDescriptor *fd, FmsInt *num_vec_comp,
                FmsLayoutType *layout_type, FmsScalarType *data_type,
                const void **data) {
  if (!field) { E_RETURN(1); }
  if (fd) { *fd = field->fd; }
  if (num_vec_comp) { *num_vec_comp = field->num_vec_comp; }
  if (layout_type) { *layout_type = field->layout; }
  if (data_type) { *data_type = field->scalar_type; }
  if (data) { *data = field->data; }
  return 0;
}